

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawWall1PalCommand::Execute(DrawWall1PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int pass_skip;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint8_t *puVar11;
  
  iVar1 = (this->super_PalWall1Command)._count;
  iVar9 = (this->super_PalWall1Command).super_DrawerCommand._dest_y;
  iVar10 = thread->pass_end_y - iVar9;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (iVar1 < iVar10) {
    iVar10 = iVar1;
  }
  uVar8 = thread->pass_start_y - iVar9;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  iVar1 = thread->num_cores;
  iVar9 = (iVar1 - (int)((iVar9 + uVar8) - thread->core) % iVar1) % iVar1;
  uVar5 = (long)(int)((~uVar8 + iVar1 + iVar10) - iVar9) / (long)iVar1;
  uVar7 = uVar5 & 0xffffffff;
  if (0 < (int)uVar5) {
    puVar3 = (this->super_PalWall1Command)._colormap;
    puVar4 = (this->super_PalWall1Command)._source;
    iVar10 = (this->super_PalWall1Command)._pitch;
    iVar9 = iVar9 + uVar8;
    puVar11 = (this->super_PalWall1Command)._dest + iVar10 * iVar9;
    iVar2 = *(int *)&(this->super_PalWall1Command).super_DrawerCommand.field_0xc;
    uVar8 = iVar9 * iVar2 + (this->super_PalWall1Command)._texturefrac;
    iVar9 = (this->super_PalWall1Command)._fracbits;
    do {
      *puVar11 = puVar3[puVar4[uVar8 >> ((byte)iVar9 & 0x3f)]];
      uVar8 = uVar8 + iVar2 * iVar1;
      puVar11 = puVar11 + iVar10 * iVar1;
      uVar6 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar6;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void DrawWall1PalCommand::Execute(DrawerThread *thread)
	{
		uint32_t fracstep = _iscale;
		uint32_t frac = _texturefrac;
		uint8_t *colormap = _colormap;
		int count = _count;
		const uint8_t *source = _source;
		uint8_t *dest = _dest;
		int bits = _fracbits;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			*dest = colormap[source[frac >> bits]];
			frac += fracstep;
			dest += pitch;
		} while (--count);
	}